

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomness.c
# Opt level: O0

int rand_bits(uint8_t *dst,size_t num_bits)

{
  int iVar1;
  ulong len;
  uint8_t *in_RSI;
  long in_RDI;
  size_t num_extra_bits;
  size_t num_bytes;
  int local_4;
  
  len = (ulong)(in_RSI + 7) >> 3;
  iVar1 = rand_bytes(in_RSI,len);
  if (iVar1 == 0) {
    if (((ulong)in_RSI & 7) != 0) {
      *(byte *)(in_RDI + (len - 1)) =
           *(byte *)(in_RDI + (len - 1)) & (byte)(0xff << (8U - (char)((ulong)in_RSI & 7) & 0x1f));
    }
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int rand_bits(uint8_t* dst, size_t num_bits) {
  const size_t num_bytes      = (num_bits + 7) / 8;
  const size_t num_extra_bits = num_bits % 8;

  if (rand_bytes(dst, num_bytes)) {
    return -1;
  }

  if (num_extra_bits) {
    dst[num_bytes - 1] &= UINT8_C(0xff) << (8 - num_extra_bits);
  }

  return 0;
}